

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::MergeFrom
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  bool is_soo_00;
  bool is_soo_01;
  int n;
  int iVar1;
  RepeatedField<float> **v1;
  RepeatedField<float> **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  float *pfVar3;
  float *src;
  float *dst;
  bool is_soo;
  int old_size;
  int other_size;
  bool other_is_soo;
  Voidify local_31;
  RepeatedField<float> *local_30;
  RepeatedField<float> *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedField<float> *other_local;
  RepeatedField<float> *this_local;
  
  local_28 = other;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)other;
  other_local = this;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::RepeatedField<float>const*>(&local_28);
  local_30 = this;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::RepeatedField<float>*>(&local_30);
  local_20 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::RepeatedField<float>const*,google::protobuf::RepeatedField<float>*>
                       (v1,v2,"&other != this");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&other_size,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x3ec,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&other_size)
    ;
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&other_size);
  }
  is_soo_00 = RepeatedField<float>::is_soo
                        ((RepeatedField<float> *)absl_log_internal_check_op_result);
  n = size((RepeatedField<float> *)absl_log_internal_check_op_result,is_soo_00);
  if (n != 0) {
    iVar1 = size(this);
    Reserve(this,iVar1 + n);
    is_soo_01 = RepeatedField<float>::is_soo(this);
    pfVar3 = elements(this,is_soo_01);
    iVar1 = ExchangeCurrentSize(this,is_soo_01,iVar1 + n);
    src = elements((RepeatedField<float> *)absl_log_internal_check_op_result,is_soo_00);
    UninitializedCopyN(src,n,pfVar3 + iVar1);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  ABSL_DCHECK_NE(&other, this);
  const bool other_is_soo = other.is_soo();
  if (auto other_size = other.size(other_is_soo)) {
    const int old_size = size();
    Reserve(old_size + other_size);
    const bool is_soo = this->is_soo();
    Element* dst =
        elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + other_size);
    UninitializedCopyN(other.elements(other_is_soo), other_size, dst);
  }
}